

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::page
          (Fl_PostScript_Graphics_Driver *this,double pw,double ph,int media)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  
  if (this->nPages == 0) {
    uVar3 = 1;
  }
  else {
    fwrite("CR\nGR\nGR\nGR\nSP\nrestore\n",0x17,1,(FILE *)this->output);
    uVar3 = this->nPages + 1;
  }
  this->nPages = uVar3;
  fprintf((FILE *)this->output,"%%%%Page: %i %i\n",(ulong)uVar3);
  uVar2 = (uint)ph;
  uVar3 = uVar2;
  if (ph < pw) {
    uVar3 = (int)pw;
  }
  uVar1 = (int)pw;
  if (ph < pw) {
    uVar1 = uVar2;
  }
  pcVar4 = "%%%%PageOrientation: Portrait\n";
  if (ph < pw) {
    pcVar4 = "%%%%PageOrientation: Landscape\n";
  }
  fprintf((FILE *)this->output,"%%%%PageBoundingBox: 0 0 %d %d\n",(ulong)uVar1,(ulong)uVar3);
  fprintf((FILE *)this->output,pcVar4);
  fprintf((FILE *)this->output,"%%%%BeginPageSetup\n");
  if ((((uint)media >> 0xc & 1) != 0) && (1 < this->lang_level_)) {
    fprintf((FILE *)this->output,"<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n",
            (ulong)(uint)(int)(pw + 0.5),(ulong)(uint)(int)(ph + 0.5),(ulong)((uint)media >> 8 & 2))
    ;
  }
  fprintf((FILE *)this->output,"%%%%EndPageSetup\n");
  reset(this);
  fwrite("save\n",5,1,(FILE *)this->output);
  fwrite("GS\n",3,1,(FILE *)this->output);
  clocale_printf(this,"%g %g TR\n",0,this->ph_);
  fwrite("1 -1 SC\n",8,1,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[5])(this,0,0,0);
  fwrite("GS\n",3,1,(FILE *)this->output);
  if (((byte)((uint)media >> 0xc) & 1 < this->lang_level_) == 0) {
    if (pw <= ph) {
      if (((uint)media >> 9 & 1) == 0) goto LAB_001fb533;
      uVar3 = (uint)-pw;
      __stream = (FILE *)this->output;
      uVar2 = (uint)-ph;
      pcVar4 = "180 rotate %i %i translate\n";
    }
    else {
      __stream = (FILE *)this->output;
      if (((uint)media >> 9 & 1) != 0) {
        fprintf(__stream,"-90 rotate %i 0 translate\n",(ulong)(uint)(int)-pw);
        goto LAB_001fb533;
      }
      uVar3 = (int)(pw - ph);
      if (this->lang_level_ != 2) {
        uVar3 = 0;
      }
      pcVar4 = "90 rotate -%i -%i translate\n";
    }
    fprintf(__stream,pcVar4,(ulong)uVar3,(ulong)uVar2);
  }
LAB_001fb533:
  fwrite("GS\nCS\n",6,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::page(double pw, double ph, int media) {
  
  if (nPages){
    fprintf(output, "CR\nGR\nGR\nGR\nSP\nrestore\n");
  }
  ++nPages;
  fprintf(output, "%%%%Page: %i %i\n" , nPages , nPages);
  fprintf(output, "%%%%PageBoundingBox: 0 0 %d %d\n", pw > ph ? (int)ph : (int)pw , pw > ph ? (int)pw : (int)ph);
  if (pw>ph){
    fprintf(output, "%%%%PageOrientation: Landscape\n");
  }else{
    fprintf(output, "%%%%PageOrientation: Portrait\n");
  }
  
  fprintf(output, "%%%%BeginPageSetup\n");
  if((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1)){
    int r = media & Fl_Paged_Device::REVERSED;
    if(r) r = 2;
    fprintf(output, "<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n", (int)(pw+.5), (int)(ph+.5), r);
  }
  fprintf(output, "%%%%EndPageSetup\n");
  
/*  pw_ = pw;
  ph_ = ph;*/
  reset();
  
  fprintf(output, "save\n");
  fprintf(output, "GS\n");
  clocale_printf( "%g %g TR\n", (double)0 /*lm_*/ , ph_ /* - tm_*/);
  fprintf(output, "1 -1 SC\n");
  line_style(0);
  fprintf(output, "GS\n");
  
  if (!((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1))){
    if (pw > ph) {
      if(media & Fl_Paged_Device::REVERSED) {
        fprintf(output, "-90 rotate %i 0 translate\n", int(-pw));
	}
      else {
        fprintf(output, "90 rotate -%i -%i translate\n", (lang_level_ == 2 ? int(pw - ph) : 0), int(ph));
	}
      }
      else {
	if(media & Fl_Paged_Device::REVERSED)
	  fprintf(output, "180 rotate %i %i translate\n", int(-pw), int(-ph));
	}
  }
  fprintf(output, "GS\nCS\n");
}